

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolver.cpp
# Opt level: O0

URL * __thiscall
miniros::master::AddressResolver::resolveAddressFor
          (AddressResolver *this,shared_ptr<miniros::master::NodeRef> *node,
          NetAddress *remoteAddress,NetAddress *localAddress)

{
  bool bVar1;
  element_type *this_00;
  element_type *peVar2;
  __shared_ptr *in_RDX;
  AddressResolver *in_RSI;
  URL *in_RDI;
  long in_R8;
  NetAddress *in_stack_00000038;
  NetAddress *addr;
  iterator __end3;
  iterator __begin3;
  set<miniros::network::NetAddress,_miniros::network::AddressCompare,_std::allocator<miniros::network::NetAddress>_>
  *__range3;
  shared_ptr<miniros::master::HostInfo> requesterHost;
  bool enabled;
  shared_ptr<const_miniros::master::HostInfo> nodeHost;
  scoped_lock<std::mutex> lock;
  URL *url;
  NodeRef *in_stack_fffffffffffffe88;
  Level level;
  URL *in_stack_fffffffffffffe90;
  undefined7 in_stack_fffffffffffffe98;
  undefined1 in_stack_fffffffffffffe9f;
  LogLocation *in_stack_fffffffffffffea0;
  void *logger_handle;
  undefined8 in_stack_fffffffffffffeb0;
  Level LVar3;
  undefined7 in_stack_fffffffffffffeb8;
  undefined1 in_stack_fffffffffffffebf;
  LogLocation *loc;
  URL *address;
  string local_120 [32];
  reference local_100;
  _Self local_f8;
  _Self local_f0;
  set<miniros::network::NetAddress,_miniros::network::AddressCompare,_std::allocator<miniros::network::NetAddress>_>
  *local_e8;
  __shared_ptr local_e0 [22];
  undefined1 local_ca;
  LogLocation local_c9 [2];
  string local_a8 [32];
  string local_88 [48];
  __shared_ptr local_58 [16];
  undefined4 local_48;
  byte local_29;
  long local_28;
  
  LVar3 = (Level)((ulong)in_stack_fffffffffffffeb0 >> 0x20);
  address = in_RDI;
  local_28 = in_R8;
  bVar1 = ::std::__shared_ptr::operator_cast_to_bool(in_RDX);
  if (bVar1) {
    local_29 = 0;
    ::std::__shared_ptr_access<miniros::master::NodeRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<miniros::master::NodeRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x549d3e);
    NodeRef::getUrl(in_stack_fffffffffffffe88);
    ::std::scoped_lock<std::mutex>::scoped_lock
              ((scoped_lock<std::mutex> *)in_stack_fffffffffffffe90,
               (mutex_type *)in_stack_fffffffffffffe88);
    if ((in_RSI->m_resolveIp & 1U) == 0) {
      local_29 = 1;
      local_48 = 1;
    }
    else {
      ::std::__shared_ptr_access<miniros::master::NodeRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<miniros::master::NodeRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x549dac);
      NodeRef::hostInfo(in_stack_fffffffffffffe88);
      ::std::weak_ptr<const_miniros::master::HostInfo>::lock
                ((weak_ptr<const_miniros::master::HostInfo> *)
                 CONCAT17(in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98));
      ::std::weak_ptr<const_miniros::master::HostInfo>::~weak_ptr
                ((weak_ptr<const_miniros::master::HostInfo> *)0x549de0);
      bVar1 = ::std::__shared_ptr::operator_cast_to_bool(local_58);
      if (bVar1) {
        findHost(in_RSI,(NetAddress *)address);
        bVar1 = ::std::__shared_ptr::operator_cast_to_bool(local_e0);
        if ((!bVar1) ||
           (bVar1 = ::std::operator==((shared_ptr<const_miniros::master::HostInfo> *)
                                      in_stack_fffffffffffffe90,
                                      (shared_ptr<miniros::master::HostInfo> *)
                                      in_stack_fffffffffffffe88), !bVar1)) {
          peVar2 = ::std::
                   __shared_ptr_access<const_miniros::master::HostInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<const_miniros::master::HostInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0x54a105);
          if ((peVar2->local & 1U) == 0) {
            ::std::
            __shared_ptr_access<const_miniros::master::HostInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<const_miniros::master::HostInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x54a16e);
            bVar1 = ::std::
                    set<miniros::network::NetAddress,_miniros::network::AddressCompare,_std::allocator<miniros::network::NetAddress>_>
                    ::empty((set<miniros::network::NetAddress,_miniros::network::AddressCompare,_std::allocator<miniros::network::NetAddress>_>
                             *)0x54a17a);
            if (!bVar1) {
              peVar2 = ::std::
                       __shared_ptr_access<const_miniros::master::HostInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator->((__shared_ptr_access<const_miniros::master::HostInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)0x54a18f);
              local_e8 = &peVar2->addresses;
              local_f0._M_node =
                   (_Base_ptr)
                   ::std::
                   set<miniros::network::NetAddress,_miniros::network::AddressCompare,_std::allocator<miniros::network::NetAddress>_>
                   ::begin((set<miniros::network::NetAddress,_miniros::network::AddressCompare,_std::allocator<miniros::network::NetAddress>_>
                            *)in_stack_fffffffffffffe88);
              local_f8._M_node =
                   (_Base_ptr)
                   ::std::
                   set<miniros::network::NetAddress,_miniros::network::AddressCompare,_std::allocator<miniros::network::NetAddress>_>
                   ::end((set<miniros::network::NetAddress,_miniros::network::AddressCompare,_std::allocator<miniros::network::NetAddress>_>
                          *)in_stack_fffffffffffffe88);
              while (bVar1 = ::std::operator!=(&local_f0,&local_f8), bVar1) {
                local_100 = ::std::_Rb_tree_const_iterator<miniros::network::NetAddress>::operator*
                                      ((_Rb_tree_const_iterator<miniros::network::NetAddress> *)
                                       in_stack_fffffffffffffe90);
                bVar1 = network::NetAddress::isLocal((NetAddress *)in_stack_fffffffffffffe90);
                if (!bVar1) {
                  network::NetAddress::str_abi_cxx11_(in_stack_00000038);
                  ::std::__cxx11::string::operator=((string *)in_RDI,local_120);
                  ::std::__cxx11::string::~string(local_120);
                  break;
                }
                ::std::_Rb_tree_const_iterator<miniros::network::NetAddress>::operator++
                          ((_Rb_tree_const_iterator<miniros::network::NetAddress> *)
                           in_stack_fffffffffffffe90);
              }
            }
          }
          else {
            ::std::__cxx11::string::operator=((string *)in_RDI,(string *)(local_28 + 8));
          }
        }
        local_29 = 1;
        local_48 = 1;
        ::std::shared_ptr<miniros::master::HostInfo>::~shared_ptr
                  ((shared_ptr<miniros::master::HostInfo> *)0x54a26e);
      }
      else {
        if (((console::g_initialized ^ 0xff) & 1) != 0) {
          console::initialize();
        }
        level = (Level)((ulong)in_stack_fffffffffffffe88 >> 0x20);
        if (((resolveAddressFor::loc.initialized_ ^ 0xffU) & 1) != 0) {
          loc = local_c9;
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string<std::allocator<char>>
                    (&address->host,(char *)in_RDI,(allocator<char> *)loc);
          ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT17(in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98),
                           (char *)in_stack_fffffffffffffe90);
          ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT17(in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98),
                           (char *)in_stack_fffffffffffffe90);
          console::initializeLogLocation
                    (loc,(string *)CONCAT17(in_stack_fffffffffffffebf,in_stack_fffffffffffffeb8),
                     LVar3);
          ::std::__cxx11::string::~string(local_88);
          ::std::__cxx11::string::~string(local_a8);
          ::std::__cxx11::string::~string((string *)&local_c9[0].logger_enabled_);
          ::std::allocator<char>::~allocator((allocator<char> *)local_c9);
        }
        if (resolveAddressFor::loc.level_ != Warn) {
          console::setLogLocationLevel((LogLocation *)in_stack_fffffffffffffe90,level);
          console::checkLogLocationEnabled(in_stack_fffffffffffffea0);
        }
        LVar3 = resolveAddressFor::loc.level_;
        local_ca = (resolveAddressFor::loc.logger_enabled_ & 1U) != 0;
        if ((bool)local_ca) {
          logger_handle = resolveAddressFor::loc.logger_;
          this_00 = ::std::
                    __shared_ptr_access<miniros::master::NodeRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<miniros::master::NodeRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)0x54a023);
          NodeRef::id_abi_cxx11_(this_00);
          in_stack_fffffffffffffe90 = (URL *)::std::__cxx11::string::c_str();
          console::print((FilterBase *)0x0,logger_handle,(Level)(ulong)LVar3,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/roscore/resolver.cpp"
                         ,0x98,
                         "network::URL miniros::master::AddressResolver::resolveAddressFor(const std::shared_ptr<NodeRef> &, const network::NetAddress &, const network::NetAddress &) const"
                         ,"No HostInfo for node %s");
        }
        local_29 = 1;
        local_48 = 1;
      }
      ::std::shared_ptr<const_miniros::master::HostInfo>::~shared_ptr
                ((shared_ptr<const_miniros::master::HostInfo> *)0x54a27b);
    }
    ::std::scoped_lock<std::mutex>::~scoped_lock((scoped_lock<std::mutex> *)0x54a299);
    if ((local_29 & 1) == 0) {
      network::URL::~URL(in_stack_fffffffffffffe90);
    }
  }
  else {
    network::URL::URL(in_stack_fffffffffffffe90);
  }
  return address;
}

Assistant:

network::URL AddressResolver::resolveAddressFor(const std::shared_ptr<NodeRef>& node,
  const network::NetAddress& remoteAddress,
  const network::NetAddress& localAddress) const
{
  assert(node);
  if (!node)
    return {};

  network::URL url = node->getUrl();

  std::scoped_lock lock(m_mutex);
  if (!m_resolveIp)
    return url;

  auto nodeHost = node->hostInfo().lock();
  if (!nodeHost) {
    MINIROS_WARN_NAMED("resolver", "No HostInfo for node %s", node->id().c_str());
    return url;
  }

  auto requesterHost = findHost(remoteAddress);
  if (requesterHost && nodeHost == requesterHost) {
    // Both requester and node are on the same host. No additional resolution is needed.
    return url;
  }

  if (nodeHost->local) {
    // Node located on this host. We can use localAddress as a good IP for a requester.
    url.host = localAddress.address;
    return url;
  }

  // Here both node and requester are located on different machines and node is not located on a local host.
  if (!nodeHost->addresses.empty()) {
    // Find first usable address.
    for (const auto& addr: nodeHost->addresses) {
      if (!addr.isLocal()) {
        url.host = addr.str();
        break;
      }
    }
  }
  return url;
}